

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstrie.cpp
# Opt level: O0

UStringTrieResult __thiscall icu_63::UCharsTrie::firstForCodePoint(UCharsTrie *this,UChar32 cp)

{
  UStringTrieResult UVar1;
  undefined4 local_28;
  undefined4 local_24;
  UChar32 cp_local;
  UCharsTrie *this_local;
  
  if (cp < 0x10000) {
    local_24 = first(this,cp);
  }
  else {
    UVar1 = first(this,(cp >> 10) + 0xd7c0U & 0xffff);
    if ((UVar1 & USTRINGTRIE_NO_VALUE) == USTRINGTRIE_NO_MATCH) {
      local_28 = USTRINGTRIE_NO_MATCH;
    }
    else {
      local_28 = next(this,cp & 0x3ffU | 0xdc00);
    }
    local_24 = local_28;
  }
  return local_24;
}

Assistant:

UStringTrieResult
UCharsTrie::firstForCodePoint(UChar32 cp) {
    return cp<=0xffff ?
        first(cp) :
        (USTRINGTRIE_HAS_NEXT(first(U16_LEAD(cp))) ?
            next(U16_TRAIL(cp)) :
            USTRINGTRIE_NO_MATCH);
}